

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void key_schedule_select_outer(ptls_key_schedule_t *sched)

{
  ptls_key_schedule_t *sched_local;
  
  if (sched->generation != 1) {
    __assert_fail("sched->generation == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x564,"void key_schedule_select_outer(ptls_key_schedule_t *)");
  }
  if (sched->num_hashes == 1) {
    if (sched->hashes[0].ctx_outer != (ptls_hash_context_t *)0x0) {
      (*(sched->hashes[0].ctx)->final)(sched->hashes[0].ctx,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
      sched->hashes[0].ctx = sched->hashes[0].ctx_outer;
      sched->hashes[0].ctx_outer = (ptls_hash_context_t *)0x0;
      return;
    }
    __assert_fail("sched->hashes[0].ctx_outer != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x566,"void key_schedule_select_outer(ptls_key_schedule_t *)");
  }
  __assert_fail("sched->num_hashes == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                ,0x565,"void key_schedule_select_outer(ptls_key_schedule_t *)");
}

Assistant:

static void key_schedule_select_outer(ptls_key_schedule_t *sched)
{
    /* This function is called when receiving a cleartext message (Server Hello), after the cipher-suite is determined (and hence
     * the hash also), if ECH was offered */
    assert(sched->generation == 1);
    assert(sched->num_hashes == 1);
    assert(sched->hashes[0].ctx_outer != NULL);

    sched->hashes[0].ctx->final(sched->hashes[0].ctx, NULL, PTLS_HASH_FINAL_MODE_FREE);
    sched->hashes[0].ctx = sched->hashes[0].ctx_outer;
    sched->hashes[0].ctx_outer = NULL;
}